

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_TreeBuilders.cpp
# Opt level: O3

bool __thiscall
Opcode::AABBTreeOfTrianglesBuilder::ComputeGlobalBox
          (AABBTreeOfTrianglesBuilder *this,udword *primitives,udword nb_prims,AABB *global_box)

{
  ulong uVar1;
  ulong uVar2;
  udword uVar3;
  MeshInterface *pMVar4;
  IndexedTriangle *pIVar5;
  Point *pPVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar24;
  float fVar25;
  undefined1 auVar23 [16];
  float fVar26;
  float fVar27;
  
  if (nb_prims != 0 && primitives != (udword *)0x0) {
    pMVar4 = this->mIMesh;
    pIVar5 = pMVar4->mTris;
    pPVar6 = pMVar4->mVerts;
    uVar3 = pMVar4->mVertexStride;
    fVar18 = 3.4028235e+38;
    fVar19 = -3.4028235e+38;
    fVar24 = -3.4028235e+38;
    fVar20 = -3.4028235e+38;
    lVar9 = 0;
    auVar16 = _DAT_001f6fe0;
    do {
      uVar7 = (ulong)(primitives[lVar9] * pMVar4->mTriStride);
      uVar11 = (ulong)(*(int *)((long)pIVar5->mVRef + uVar7) * uVar3);
      uVar10 = (ulong)(*(int *)((long)pIVar5->mVRef + uVar7 + 4) * uVar3);
      uVar8 = (ulong)(*(int *)((long)pIVar5->mVRef + uVar7 + 8) * uVar3);
      uVar7 = *(ulong *)((long)&pPVar6->y + uVar11);
      fVar22 = (float)(uVar7 >> 0x20);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uVar7;
      auVar16 = minps(auVar16,auVar17);
      uVar1 = *(ulong *)((long)&pPVar6->y + uVar10);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar1;
      auVar17 = minps(auVar16,auVar23);
      uVar2 = *(ulong *)((long)&pPVar6->y + uVar8);
      fVar21 = (float)(uVar2 >> 0x20);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar2;
      auVar16 = minps(auVar17,auVar16);
      fVar25 = *(float *)((long)&pPVar6->x + uVar11);
      uVar12 = -(uint)((float)uVar7 < fVar19);
      uVar13 = -(uint)(fVar22 < fVar24);
      fVar26 = (float)(~-(uint)(fVar18 < fVar25) & (uint)fVar25 |
                      (uint)fVar18 & -(uint)(fVar18 < fVar25));
      fVar27 = (float)(~uVar12 & (uint)(float)uVar7 | (uint)fVar19 & uVar12);
      fVar22 = (float)(~uVar13 & (uint)fVar22 | (uint)fVar24 & uVar13);
      fVar20 = (float)(~-(uint)(fVar25 < fVar20) & (uint)fVar25 |
                      (uint)fVar20 & -(uint)(fVar25 < fVar20));
      fVar18 = *(float *)((long)&pPVar6->x + uVar10);
      fVar24 = (float)(uVar1 >> 0x20);
      uVar12 = -(uint)(fVar26 < fVar18);
      uVar13 = -(uint)((float)uVar1 < fVar27);
      uVar14 = -(uint)(fVar24 < fVar22);
      uVar15 = -(uint)(fVar18 < fVar20);
      fVar19 = (float)(~uVar12 & (uint)fVar18 | (uint)fVar26 & uVar12);
      fVar25 = (float)(~uVar13 & (uint)(float)uVar1 | (uint)fVar27 & uVar13);
      fVar24 = (float)(~uVar14 & (uint)fVar24 | (uint)fVar22 & uVar14);
      fVar22 = (float)(~uVar15 & (uint)fVar18 | (uint)fVar20 & uVar15);
      fVar20 = *(float *)((long)&pPVar6->x + uVar8);
      uVar12 = -(uint)(fVar19 < fVar20);
      uVar13 = -(uint)((float)uVar2 < fVar25);
      uVar14 = -(uint)(fVar21 < fVar24);
      uVar15 = -(uint)(fVar20 < fVar22);
      fVar18 = (float)(~uVar12 & (uint)fVar20 | (uint)fVar19 & uVar12);
      fVar19 = (float)(~uVar13 & (uint)(float)uVar2 | (uint)fVar25 & uVar13);
      fVar24 = (float)(~uVar14 & (uint)fVar21 | (uint)fVar24 & uVar14);
      fVar20 = (float)(~uVar15 & (uint)fVar20 | (uint)fVar22 & uVar15);
      lVar9 = lVar9 + 1;
    } while (nb_prims != (udword)lVar9);
    (global_box->mCenter).x = (fVar20 + fVar18) * 0.5;
    (global_box->mCenter).y = (auVar16._0_4_ + fVar19) * 0.5;
    (global_box->mCenter).z = (auVar16._4_4_ + fVar24) * 0.5;
    (global_box->mExtents).x = (fVar20 - fVar18) * 0.5;
    (global_box->mExtents).y = (fVar19 - auVar16._0_4_) * 0.5;
    (global_box->mExtents).z = (fVar24 - auVar16._4_4_) * 0.5;
  }
  return nb_prims != 0 && primitives != (udword *)0x0;
}

Assistant:

bool AABBTreeOfTrianglesBuilder::ComputeGlobalBox(const udword* primitives, udword nb_prims, AABB& global_box) const
{
	// Checkings
	if(!primitives || !nb_prims)	return false;

	// Initialize global box
	Point Min(MAX_FLOAT, MAX_FLOAT, MAX_FLOAT);
	Point Max(MIN_FLOAT, MIN_FLOAT, MIN_FLOAT);

	// Loop through triangles
	VertexPointers VP;
	while(nb_prims--)
	{
		// Get current triangle-vertices
		mIMesh->GetTriangle(VP, *primitives++);
		// Update global box
		Min.Min(*VP.Vertex[0]).Min(*VP.Vertex[1]).Min(*VP.Vertex[2]);
		Max.Max(*VP.Vertex[0]).Max(*VP.Vertex[1]).Max(*VP.Vertex[2]);
	}
	global_box.SetMinMax(Min, Max);
	return true;
}